

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_load_extension(sqlite3 *db,char *zFile,char *zProc,char **pzErrMsg)

{
  ulong uVar1;
  byte bVar2;
  sqlite3_vfs *psVar3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  void *pvVar8;
  _func_void *p_Var9;
  size_t sVar10;
  ulong uVar11;
  byte *pbVar12;
  void **__dest;
  uint uVar13;
  u64 n;
  long lVar14;
  uint uVar15;
  int rc;
  long in_FS_OFFSET;
  char *zErrmsg;
  char *local_48;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  psVar3 = db->pVfs;
  local_40 = (char *)0x0;
  sVar6 = strlen(zFile);
  if (pzErrMsg != (char **)0x0) {
    *pzErrMsg = (char *)0x0;
  }
  if ((db->flags & 0x10000) == 0) {
    rc = 1;
    bVar4 = true;
    if (pzErrMsg != (char **)0x0) {
      pcVar7 = sqlite3_mprintf("not authorized");
      *pzErrMsg = pcVar7;
    }
  }
  else {
    local_48 = "sqlite3_extension_init";
    if (zProc != (char *)0x0) {
      local_48 = zProc;
    }
    if (sVar6 - 0x1001 < 0xfffffffffffff000) {
LAB_0012947b:
      rc = 1;
      bVar4 = true;
      if (pzErrMsg != (char **)0x0) {
        iVar5 = sqlite3_initialize();
        if (iVar5 == 0) {
          local_40 = (char *)sqlite3Malloc(sVar6 + 300);
        }
        else {
          local_40 = (char *)0x0;
        }
        *pzErrMsg = local_40;
        if (local_40 != (char *)0x0) {
          sqlite3_snprintf((int)(sVar6 + 300),local_40,"unable to open shared library [%.*s]",0x1000
                           ,zFile);
          (*psVar3->xDlError)(psVar3,(int)sVar6 + 299,local_40);
        }
      }
    }
    else {
      pvVar8 = (*psVar3->xDlOpen)(psVar3,zFile);
      bVar4 = true;
      do {
        if ((!bVar4) || (pvVar8 != (void *)0x0)) {
          if (pvVar8 == (void *)0x0) goto LAB_0012947b;
          p_Var9 = (*psVar3->xDlSym)(psVar3,pvVar8,local_48);
          uVar15 = 0;
          if (zProc != (char *)0x0 || p_Var9 != (_func_void *)0x0) {
            pcVar7 = (char *)0x0;
            goto LAB_001296d9;
          }
          if (zFile != (char *)0x0) {
            sVar10 = strlen(zFile);
            uVar15 = (uint)sVar10 & 0x3fffffff;
          }
          iVar5 = sqlite3_initialize();
          if (iVar5 == 0) {
            pcVar7 = (char *)sqlite3Malloc((ulong)(uVar15 + 0x1e));
          }
          else {
            pcVar7 = (char *)0x0;
          }
          if (pcVar7 != (char *)0x0) {
            builtin_strncpy(pcVar7,"sqlite3_",8);
            uVar11 = (ulong)uVar15;
            goto LAB_0012960d;
          }
          (*psVar3->xDlClose)(psVar3,pvVar8);
          p_Var9 = (_func_void *)0x0;
          goto LAB_001296d0;
        }
        pcVar7 = sqlite3_mprintf("%s.%s",zFile,"so");
        if (pcVar7 == (char *)0x0) {
          pvVar8 = (void *)0x0;
        }
        else {
          if (sVar6 < 0xffe) {
            pvVar8 = (*psVar3->xDlOpen)(psVar3,pcVar7);
          }
          else {
            pvVar8 = (void *)0x0;
          }
          sqlite3_free(pcVar7);
        }
        bVar4 = false;
      } while (pcVar7 != (char *)0x0);
      rc = 7;
      bVar4 = true;
    }
  }
  goto LAB_00129862;
  while (uVar1 = uVar11 - 1, lVar14 = uVar11 - 1, uVar11 = uVar1, zFile[lVar14] != '/') {
LAB_0012960d:
    if ((long)uVar11 < 1) {
      uVar15 = 0;
      goto LAB_0012963d;
    }
  }
  uVar15 = (int)uVar1 + 1;
LAB_0012963d:
  iVar5 = sqlite3_strnicmp(zFile + uVar15,"lib",3);
  uVar13 = uVar15 + 3;
  if (iVar5 != 0) {
    uVar13 = uVar15;
  }
  iVar5 = 8;
  for (pbVar12 = (byte *)(zFile + (int)uVar13); (bVar2 = *pbVar12, bVar2 != 0 && (bVar2 != 0x2e));
      pbVar12 = pbVar12 + 1) {
    if ((""[bVar2] & 2) != 0) {
      lVar14 = (long)iVar5;
      iVar5 = iVar5 + 1;
      pcVar7[lVar14] = ""[(uint)(int)(char)bVar2];
    }
  }
  (pcVar7 + (long)iVar5 + 4)[0] = 't';
  (pcVar7 + (long)iVar5 + 4)[1] = '\0';
  builtin_strncpy(pcVar7 + iVar5,"_ini",4);
  p_Var9 = (*psVar3->xDlSym)(psVar3,pvVar8,pcVar7);
  local_48 = pcVar7;
LAB_001296d0:
  if (pcVar7 == (char *)0x0) {
LAB_001297fa:
    rc = 7;
  }
  else {
LAB_001296d9:
    if (p_Var9 == (_func_void *)0x0) {
      if (pzErrMsg != (char **)0x0) {
        sVar10 = strlen(local_48);
        n = sVar6 + sVar10 + 300;
        iVar5 = sqlite3_initialize();
        if (iVar5 == 0) {
          local_40 = (char *)sqlite3Malloc(n);
        }
        else {
          local_40 = (char *)0x0;
        }
        *pzErrMsg = local_40;
        if (local_40 != (char *)0x0) {
          iVar5 = (int)n;
          sqlite3_snprintf(iVar5,local_40,"no entry point [%s] in shared library [%s]",local_48,
                           zFile);
          (*psVar3->xDlError)(psVar3,iVar5 + -1,local_40);
        }
      }
      (*psVar3->xDlClose)(psVar3,pvVar8);
      sqlite3_free(pcVar7);
    }
    else {
      sqlite3_free(pcVar7);
      iVar5 = (*p_Var9)(db,&local_40,&sqlite3Apis);
      if (iVar5 == 0) {
        __dest = (void **)sqlite3DbMallocZero(db,(long)db->nExtension * 8 + 8);
        if (__dest != (void **)0x0) {
          if (0 < (long)db->nExtension) {
            memcpy(__dest,db->aExtension,(long)db->nExtension << 3);
          }
          if (db->aExtension != (void **)0x0) {
            sqlite3DbFreeNN(db,db->aExtension);
          }
          db->aExtension = __dest;
          iVar5 = db->nExtension;
          db->nExtension = iVar5 + 1;
          __dest[iVar5] = pvVar8;
          bVar4 = false;
          rc = 0;
          goto LAB_00129862;
        }
        goto LAB_001297fa;
      }
      bVar4 = false;
      rc = 0;
      if (iVar5 == 0x100) goto LAB_00129862;
      if (pzErrMsg != (char **)0x0) {
        pcVar7 = sqlite3_mprintf("error during initialization: %s",local_40);
        *pzErrMsg = pcVar7;
      }
      sqlite3_free(local_40);
      (*psVar3->xDlClose)(psVar3,pvVar8);
    }
    rc = 1;
  }
  bVar4 = true;
LAB_00129862:
  if ((bVar4) || (iVar5 = 0, db->mallocFailed != '\0')) {
    iVar5 = apiHandleError(db,rc);
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar5;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_API int sqlite3_load_extension(
  sqlite3 *db,          /* Load the extension into this database connection */
  const char *zFile,    /* Name of the shared library containing extension */
  const char *zProc,    /* Entry point.  Use "sqlite3_extension_init" if 0 */
  char **pzErrMsg       /* Put error message here if not 0 */
){
  int rc;
  sqlite3_mutex_enter(db->mutex);
  rc = sqlite3LoadExtension(db, zFile, zProc, pzErrMsg);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}